

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O3

pair<char_*,_bool> __thiscall
uWS::AsyncSocket<false>::getSendBuffer(AsyncSocket<false> *this,size_t size)

{
  int iVar1;
  LoopData *pLVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  pair<char_*,_bool> pVar5;
  
  pLVar2 = getLoopData(this);
  if ((AsyncSocket<false> *)pLVar2->corkedSocket == this) {
    iVar1 = pLVar2->corkOffset;
    if ((long)iVar1 + size < 0x4000) {
      pcVar3 = pLVar2->corkBuffer + iVar1;
      pLVar2->corkOffset = (int)size + iVar1;
      uVar4 = 0;
      goto LAB_00147da4;
    }
  }
  pcVar3 = (char *)malloc(size);
  uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00147da4:
  pVar5._8_8_ = uVar4;
  pVar5.first = pcVar3;
  return pVar5;
}

Assistant:

std::pair<char *, bool> getSendBuffer(size_t size) {
        /* If we are corked and we have room, return the cork buffer itself */
        LoopData *loopData = getLoopData();
        if (loopData->corkedSocket == this && loopData->corkOffset + size < LoopData::CORK_BUFFER_SIZE) {
            char *sendBuffer = loopData->corkBuffer + loopData->corkOffset;
            loopData->corkOffset += (int) size;
            return {sendBuffer, false};
        } else {
            /* Slow path for now, we want to always be corked if possible */
            return {(char *) malloc(size), true};
        }
    }